

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O1

void __thiscall imrt::Volume::set_data(Volume *this,string *file)

{
  Collimator *this_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  istream *piVar5;
  _List_node_base *p_Var6;
  mapped_type *pmVar7;
  runtime_error *this_01;
  long lVar8;
  int iVar9;
  _List_node_base *p_Var10;
  int angle;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string linec;
  stringstream ss;
  ifstream myfile;
  int local_43c;
  value_type local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_418;
  double local_3f8;
  Matrix local_3f0;
  undefined1 *local_3e0;
  undefined8 local_3d8;
  undefined1 local_3d0 [16];
  long local_3c0 [3];
  string local_3a8 [104];
  ios_base local_340 [264];
  long local_238 [65];
  
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  local_438._M_string_length = 0;
  local_438.field_2._M_local_buf[0] = '\0';
  local_3e0 = local_3d0;
  local_3d8 = 0;
  local_3d0[0] = 0;
  std::ifstream::ifstream(local_238,(string *)file,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  this->nb_voxels = -1;
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    local_418.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_418.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_418.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cVar2 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_438,cVar2);
    while( true ) {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_438,cVar2);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_418,&local_438);
    }
    std::ifstream::close();
    this->nb_voxels =
         (int)((ulong)((long)local_418.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_418.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1;
    std::__cxx11::stringbuf::str(local_3a8);
    p_Var6 = (_List_node_base *)Collimator::getAngles_abi_cxx11_(this->collimator);
    p_Var10 = p_Var6->_M_next;
    if (p_Var10 != p_Var6) {
      do {
        local_43c = *(int *)&p_Var10[1]._M_next;
        iVar9 = this->nb_voxels;
        iVar3 = Collimator::getNangleBeamlets(this->collimator,local_43c);
        maths::Matrix::Matrix(&local_3f0,iVar9,iVar3);
        pmVar7 = std::
                 map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                 ::operator[](&this->D,&local_43c);
        maths::Matrix::operator=(pmVar7,&local_3f0);
        maths::Matrix::~Matrix(&local_3f0);
        p_Var10 = (((_List_base<int,_std::allocator<int>_> *)&p_Var10->_M_next)->_M_impl)._M_node.
                  super__List_node_base._M_next;
      } while (p_Var10 != p_Var6);
    }
    if (0 < this->nb_voxels) {
      lVar8 = 0;
      do {
        std::ios::clear((int)*(undefined8 *)(local_3c0[0] + -0x18) + (int)local_3c0);
        std::__cxx11::stringbuf::str(local_3a8);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3c0,(string *)&local_438,'\t');
        iVar3 = 0;
        iVar9 = 0;
        while( true ) {
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_3c0,(string *)&local_438,'\t');
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
          this_00 = this->collimator;
          iVar4 = Collimator::getAngle(this_00,iVar3);
          iVar4 = Collimator::getNangleBeamlets(this_00,iVar4);
          bVar1 = iVar4 <= iVar9;
          if (iVar4 <= iVar9) {
            iVar9 = 0;
          }
          iVar3 = iVar3 + (uint)bVar1;
          local_3f8 = atof(local_438._M_dataplus._M_p);
          local_3f0.rows_ = Collimator::getAngle(this->collimator,iVar3);
          pmVar7 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[](&this->D,&local_3f0.rows_);
          pmVar7->p[lVar8][iVar9] = local_3f8;
          iVar9 = iVar9 + 1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < this->nb_voxels);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_418);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
    std::ios_base::~ios_base(local_340);
    std::ifstream::~ifstream(local_238);
    if (local_3e0 != local_3d0) {
      operator_delete(local_3e0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"error reading file.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Volume::set_data(string file) {
  string line, linec;
  ifstream myfile (file);
  stringstream ss;
  double aux1, aux2;
  vector <pair<double,double> >::iterator it;

  //nb_beamlets=-1;
  nb_voxels=-1;

  if (!myfile.is_open())
    throw runtime_error("error reading file.");

  // Get dimensions of the matrix voxels/beamlets matrix
  vector<string> lines;
  // First line not considered
  // TODO: read name of the volume!
  getline (myfile,line);
  // Initial reading
  while (getline (myfile,line) )
    lines.push_back(line);
  myfile.close();
  nb_voxels = lines.size()-1;
  ss.str(lines[0]);

  for(auto angle:collimator.getAngles())
    D[angle]=Matrix(nb_voxels, collimator.getNangleBeamlets(angle));

  for (int i=0; i<nb_voxels; i++) {
    ss.clear(); ss.str(lines[i]);
    getline(ss, line, '\t');
    int a=0, j=0;
    int count=0;
    while (getline(ss, line, '\t') ) {
      if (j >= collimator.getNangleBeamlets( collimator.getAngle(a) )) {
        a++; j=0;
      }
      D[ collimator.getAngle(a) ](i,j)=atof(line.c_str());
      j++;
    }
  }

}